

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfftpack.c
# Opt level: O2

int dst_forward(fft_t *f,double *data)

{
  int *n;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  int ier;
  double local_20;
  
  if (data != (double *)0x0 && f != (fft_t *)0x0) {
    ier = 0;
    if (f->ortho != 0) {
      dVar6 = 1.0 / (double)f->n;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar7 = 0.5 / (double)f->n;
      if (dVar7 < 0.0) {
        local_20 = dVar6;
        dVar7 = sqrt(dVar7);
        dVar6 = local_20;
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      *data = dVar6 * *data;
      iVar1 = f->n;
      for (lVar4 = 1; lVar4 < iVar1; lVar4 = lVar4 + 1) {
        data[lVar4] = data[lVar4] * dVar7;
      }
    }
    n = &f->n;
    sinq1f_(n,&f->inc,data,n,f->save,&f->lensav,f->work,&f->lenwork,&ier);
    if (f->ortho != 0) {
      uVar2 = *n;
      uVar5 = 0;
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar5;
      }
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        data[uVar5] = data[uVar5] * (double)(int)uVar2;
      }
    }
    return ier;
  }
  return -1;
}

Assistant:

int dst_forward(fft_t *f, fft_real_t *data){
  if (!f || !data)
    return -1;
  int ier=0;
  if (f->ortho){
    fft_real_t m0,m;
    m0 = sqrt(1.0/f->n);
    m  = sqrt(0.5/f->n);
    data[0]*=m0;
    int n;
    for (n=1; n<f->n; n++)
      data[n] *= m;
  }
  sinq1f_(&f->n, &f->inc, data, &f->n, f->save, &f->lensav, f->work, &f->lenwork, &ier);
  if (f->ortho){
    fft_real_t m = f->n;
    int n;
    for (n=0; n<f->n; n++)
      data[n] *= m;
  }
  if (ier)
    return ier;
  return 0;
}